

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

void Option::prepareProject(QString *pfile)

{
  long in_FS_OFFSET;
  QFileInfo local_70 [8];
  QArrayDataPointer<char16_t> local_68;
  QFileInfo local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(local_70,(QString *)pfile);
  QFileInfo::absolutePath();
  QFileInfo::QFileInfo(local_50,(QString *)&local_68);
  QFileInfo::canonicalFilePath();
  QFileInfo::~QFileInfo(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QFileInfo::~QFileInfo(local_70);
  QMakeGlobals::setDirectories(globals,(QString *)&local_48,&output_dir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Option::prepareProject(const QString &pfile)
{
    // Canonicalize only the directory, otherwise things will go haywire
    // if the file itself is a symbolic link.
    const QString srcpath = QFileInfo(QFileInfo(pfile).absolutePath()).canonicalFilePath();
    globals->setDirectories(srcpath, output_dir);
}